

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shaders.cpp
# Opt level: O2

void __thiscall fw::Shader::compile(Shader *this,GLenum shaderType)

{
  GLuint GVar1;
  ostream *poVar2;
  GLint success;
  vector<const_char_*,_std::allocator<const_char_*>_> transformedSources;
  GLchar infoLog [512];
  int local_23c;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_238;
  GLchar local_218 [512];
  
  local_238._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_start = (GLchar **)0x0;
  local_238._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<char_const*,std::allocator<char_const*>>>,char_const*(*)(std::__cxx11::string_const&)>
            ((this->_sources).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->_sources).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)&local_238,transformStringToCStr
            );
  GVar1 = (*glad_glCreateShader)(shaderType);
  (*glad_glShaderSource)
            (GVar1,(GLsizei)((ulong)((long)local_238._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_238._M_impl.super__Vector_impl_data._M_start) >> 3),
             local_238._M_impl.super__Vector_impl_data._M_start,(GLint *)0x0);
  (*glad_glCompileShader)(GVar1);
  (*glad_glGetShaderiv)(GVar1,0x8b81,&local_23c);
  if (local_23c == 0) {
    (*glad_glGetShaderInfoLog)(GVar1,0x200,(GLsizei *)0x0,local_218);
    poVar2 = std::operator<<((ostream *)&std::cout,"Error: Shader compilation failed");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,local_218);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    this->_shaderType = shaderType;
    this->_shaderId = GVar1;
  }
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_238);
  return;
}

Assistant:

void Shader::compile(GLenum shaderType)
{
    vector<const char *> transformedSources;

    transform(
        _sources.begin(),
        _sources.end(),
        back_inserter(transformedSources),
        transformStringToCStr
    );

    GLuint shader = glCreateShader(shaderType);

    glShaderSource(
        shader,
        transformedSources.size(),
        transformedSources.data(),
        nullptr
    );

    glCompileShader(shader);

    GLint success;
    GLchar infoLog[512];
    glGetShaderiv(shader, GL_COMPILE_STATUS, &success);
    if (!success) {
        glGetShaderInfoLog(shader, 512, nullptr, infoLog);
        std::cout << "Error: Shader compilation failed" << std::endl
            << infoLog << std::endl;
        return; // todo: throw exception
    }

    _shaderType = shaderType;
    _shaderId = shader;
}